

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,(unsigned_char)8>(Thread *this)

{
  difference_type __n;
  ulong uVar1;
  long lVar2;
  Value value;
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  Value local_18;
  
  local_18 = Pop(this);
  value._8_8_ = local_18._8_8_;
  uVar1 = 0;
  lVar2 = 0;
  do {
    uVar1 = (uVar1 + 1) - (ulong)(*(short *)((long)&local_18 + lVar2) == 0);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x10);
  value.i64_._1_7_ = 0;
  value.v128_.v[0] = 7 < uVar1;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}